

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O0

int nni_taskq_sys_init(nng_init_params *params)

{
  short sVar1;
  int iVar2;
  short local_12;
  int16_t max_thr;
  int16_t num_thr;
  nng_init_params *params_local;
  
  sVar1 = params->max_task_threads;
  local_12 = params->num_task_threads;
  if ((0 < sVar1) && (sVar1 < local_12)) {
    local_12 = sVar1;
  }
  if (local_12 < 2) {
    local_12 = 2;
  }
  params->num_task_threads = local_12;
  iVar2 = nni_taskq_init(&nni_taskq_systq,(int)local_12);
  return iVar2;
}

Assistant:

int
nni_taskq_sys_init(nng_init_params *params)
{
	int16_t num_thr;
	int16_t max_thr;

	max_thr = params->max_task_threads;
	num_thr = params->num_task_threads;

	if ((max_thr > 0) && (num_thr > max_thr)) {
		num_thr = max_thr;
	}
	if (num_thr < 2) {
		num_thr = 2;
	}
	params->num_task_threads = num_thr;

	return (nni_taskq_init(&nni_taskq_systq, (int) num_thr));
}